

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

int __thiscall QTextEditPrivate::init(QTextEditPrivate *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  QWidget *this_00;
  QWidgetTextControl *pQVar2;
  QSizeF *pQVar3;
  QPaintDevice *pQVar4;
  long in_FS_OFFSET;
  QTextDocument *doc;
  QTextEdit *q;
  QPalette *in_stack_fffffffffffffd38;
  ulong uVar5;
  QSize *sz;
  FocusPolicy policy;
  QWidget *in_stack_fffffffffffffd40;
  QWidget *this_01;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  undefined4 uVar6;
  array<QMetaObject::Connection,_13UL> *in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd58;
  QFlagsStorage<Qt::InputMethodHint> hints;
  QWidget *pQVar7;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 uVar8;
  ContextType *in_stack_fffffffffffffd88;
  code *context;
  Object *in_stack_fffffffffffffd90;
  QSizeF *pQVar9;
  Object *in_stack_fffffffffffffda0;
  offset_in_QWidgetTextControl_to_subr in_stack_fffffffffffffdb0;
  offset_in_QWidgetTextControl_to_subr in_stack_fffffffffffffdc0;
  ConnectionType type;
  offset_in_QWidgetTextControl_to_subr in_stack_fffffffffffffdd0;
  ConnectionType in_stack_fffffffffffffde0;
  ConnectionType type_00;
  QCursor local_158 [5];
  QWidget *local_130;
  code *local_128;
  undefined8 local_120;
  code *local_118;
  undefined8 local_110;
  code *local_108;
  undefined8 local_100;
  code *local_f8;
  undefined8 local_f0;
  code *local_e8;
  undefined8 local_e0;
  code *local_d8;
  undefined8 local_d0;
  QWidget *local_c8;
  code *local_c0;
  undefined8 uStack_b8;
  code *local_b0;
  undefined8 uStack_a8;
  code *local_a0;
  undefined8 uStack_98;
  code *local_90;
  undefined8 uStack_88;
  code *local_80;
  undefined8 uStack_78;
  long local_8;
  
  hints.i = (Int)((ulong)in_stack_fffffffffffffd58 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidget *)q_func(this);
  pQVar2 = (QWidgetTextControl *)operator_new(0x18);
  QTextEditControl::QTextEditControl
            ((QTextEditControl *)in_stack_fffffffffffffd40,(QObject *)in_stack_fffffffffffffd38);
  this->control = pQVar2;
  QWidget::palette(in_stack_fffffffffffffd40);
  QWidgetTextControl::setPalette
            ((QWidgetTextControl *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  local_80 = adjustScrollbars;
  uStack_78 = 0;
  uVar8 = 0;
  QObjectPrivate::connect<void(QWidgetTextControl::*)(QSizeF_const&),void(QTextEditPrivate::*)()>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffdd0,this,in_stack_fffffffffffffdc0,
             (ConnectionType)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  local_90 = repaintContents;
  uStack_88 = 0;
  QObjectPrivate::
  connect<void(QWidgetTextControl::*)(QRectF_const&),void(QTextEditPrivate::*)(QRectF_const&)>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffdd0,this,in_stack_fffffffffffffdc0,
             (ConnectionType)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  local_a0 = ensureVisible;
  uStack_98 = 0;
  QObjectPrivate::
  connect<void(QWidgetTextControl::*)(QRectF_const&),void(QTextEditPrivate::*)(QRectF_const&)>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffdd0,this,in_stack_fffffffffffffdc0,
             (ConnectionType)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  local_b0 = hoveredBlockWithMarkerChanged;
  uStack_a8 = 0;
  QObjectPrivate::
  connect<void(QWidgetTextControl::*)(QTextBlock_const&),void(QTextEditPrivate::*)(QTextBlock_const&)>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffdd0,this,in_stack_fffffffffffffdc0,
             (ConnectionType)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  local_c0 = cursorPositionChanged;
  uStack_b8 = 0;
  uVar5 = 0;
  this_01 = (QWidget *)0x0;
  QObjectPrivate::connect<void(QWidgetTextControl::*)(),void(QTextEditPrivate::*)()>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffdd0,this,in_stack_fffffffffffffdc0,
             (ConnectionType)((ulong)in_stack_fffffffffffffd90 >> 0x20));
  type = (ConnectionType)in_stack_fffffffffffffdd0;
  uVar5 = uVar5 & 0xffffffff00000000;
  local_c8 = this_00;
  QObject::connect<void(QWidgetTextControl::*)(),QTextEditPrivate::init(QString_const&)::__0>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffdc0,(ContextType *)this,
             (anon_class_8_1_54a39811_for_o *)in_stack_fffffffffffffd90,in_stack_fffffffffffffde0);
  local_d8 = QTextEdit::currentCharFormatChanged;
  local_d0 = 0;
  uVar5 = uVar5 & 0xffffffff00000000;
  QObject::
  connect<void(QWidgetTextControl::*)(QTextCharFormat_const&),void(QTextEdit::*)(QTextCharFormat_const&)>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffdb0,in_stack_fffffffffffffd88,
             (offset_in_QTextEdit_to_subr *)CONCAT44(uVar8,in_stack_fffffffffffffd80),type);
  local_e8 = QTextEdit::textChanged;
  local_e0 = 0;
  context = QWidgetTextControl::textChanged;
  uVar5 = uVar5 & 0xffffffff00000000;
  QObject::connect<void(QWidgetTextControl::*)(),void(QTextEdit::*)()>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffdb0,
             (ContextType *)QWidgetTextControl::textChanged,
             (offset_in_QTextEdit_to_subr *)CONCAT44(uVar8,in_stack_fffffffffffffd80),type);
  local_f8 = QTextEdit::undoAvailable;
  local_f0 = 0;
  uVar5 = uVar5 & 0xffffffff00000000;
  QObject::connect<void(QWidgetTextControl::*)(bool),void(QTextEdit::*)(bool)>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffdb0,(ContextType *)context,
             (offset_in_QTextEdit_to_subr *)CONCAT44(uVar8,in_stack_fffffffffffffd80),type);
  local_108 = QTextEdit::redoAvailable;
  local_100 = 0;
  uVar5 = uVar5 & 0xffffffff00000000;
  QObject::connect<void(QWidgetTextControl::*)(bool),void(QTextEdit::*)(bool)>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffdb0,(ContextType *)context,
             (offset_in_QTextEdit_to_subr *)CONCAT44(uVar8,in_stack_fffffffffffffd80),type);
  local_118 = QTextEdit::copyAvailable;
  local_110 = 0;
  type_00 = 0x7123a0;
  uVar5 = uVar5 & 0xffffffff00000000;
  QObject::connect<void(QWidgetTextControl::*)(bool),void(QTextEdit::*)(bool)>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffdb0,(ContextType *)context,
             (offset_in_QTextEdit_to_subr *)CONCAT44(uVar8,in_stack_fffffffffffffd80),type);
  local_128 = QTextEdit::selectionChanged;
  local_120 = 0;
  uVar5 = uVar5 & 0xffffffff00000000;
  QObject::connect<void(QWidgetTextControl::*)(),void(QTextEdit::*)()>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffdb0,(ContextType *)context,
             (offset_in_QTextEdit_to_subr *)CONCAT44(uVar8,in_stack_fffffffffffffd80),0x712370);
  sz = (QSize *)(uVar5 & 0xffffffff00000000);
  local_130 = this_00;
  QObject::connect<void(QWidgetTextControl::*)(),QTextEditPrivate::init(QString_const&)::__1>
            (in_stack_fffffffffffffda0,(offset_in_QWidgetTextControl_to_subr)context,
             (ContextType *)this,(anon_class_8_1_54a39811_for_o *)in_stack_fffffffffffffd90,type_00)
  ;
  std::array<QMetaObject::Connection,_13UL>::operator=
            (in_stack_fffffffffffffd50,
             (array<QMetaObject::Connection,_13UL> *)
             CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  std::array<QMetaObject::Connection,_13UL>::~array(in_stack_fffffffffffffd50);
  pQVar3 = (QSizeF *)QWidgetTextControl::document((QWidgetTextControl *)this_01);
  pQVar9 = pQVar3;
  QSize::QSize((QSize *)this_01,(int)((ulong)sz >> 0x20),(int)sz);
  QSizeF::QSizeF((QSizeF *)this_01,sz);
  QTextDocument::setPageSize(pQVar9);
  pQVar4 = (QPaintDevice *)QTextDocument::documentLayout();
  pQVar7 = (this->super_QAbstractScrollAreaPrivate).viewport;
  QAbstractTextDocumentLayout::setPaintDevice(pQVar4);
  QWidget::font(this_00);
  QTextDocument::setDefaultFont((QFont *)pQVar3);
  QTextDocument::setUndoRedoEnabled(SUB81(pQVar3,0));
  QTextDocument::setUndoRedoEnabled(SUB81(pQVar3,0));
  bVar1 = QString::isEmpty((QString *)0x6cf6ef);
  if (!bVar1) {
    QWidgetTextControl::setHtml((QWidgetTextControl *)this_01,(QString *)sz);
  }
  uVar8 = 0x14;
  policy = (FocusPolicy)((ulong)sz >> 0x20);
  QAbstractSlider::setSingleStep((QAbstractSlider *)this_01,policy);
  QAbstractSlider::setSingleStep((QAbstractSlider *)this_01,policy);
  QWidget::setBackgroundRole(this_01,policy);
  uVar6 = 1;
  QWidget::setMouseTracking(this_01,SUB41(policy >> 0x18,0));
  QWidget::setAcceptDrops(this_01,SUB41(policy >> 0x18,0));
  QWidget::setFocusPolicy(this_01,policy);
  QWidget::setAttribute
            (pQVar7,(WidgetAttribute)((ulong)pQVar4 >> 0x20),SUB81((ulong)pQVar4 >> 0x18,0));
  QWidget::setAttribute
            (pQVar7,(WidgetAttribute)((ulong)pQVar4 >> 0x20),SUB81((ulong)pQVar4 >> 0x18,0));
  QFlags<Qt::InputMethodHint>::QFlags((QFlags<Qt::InputMethodHint> *)this_01,policy);
  QWidget::setInputMethodHints((QWidget *)CONCAT44(uVar6,uVar8),(InputMethodHints)hints.i);
  pQVar7 = (this->super_QAbstractScrollAreaPrivate).viewport;
  QCursor::QCursor(local_158,IBeamCursor);
  QWidget::setCursor(pQVar7,(QCursor *)this_00);
  QCursor::~QCursor(local_158);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QTextEditPrivate::init(const QString &html)
{
    Q_Q(QTextEdit);
    control = new QTextEditControl(q);
    control->setPalette(q->palette());

    connections = {
        QObjectPrivate::connect(control, &QTextEditControl::documentSizeChanged,
                                this, &QTextEditPrivate::adjustScrollbars),
        QObjectPrivate::connect(control, &QTextEditControl::updateRequest,
                                this, &QTextEditPrivate::repaintContents),
        QObjectPrivate::connect(control, &QTextEditControl::visibilityRequest,
                                this, &QTextEditPrivate::ensureVisible),
        QObjectPrivate::connect(control, &QTextEditControl::blockMarkerHovered,
                                this, &QTextEditPrivate::hoveredBlockWithMarkerChanged),
        QObjectPrivate::connect(control, &QTextEditControl::cursorPositionChanged,
                                this, &QTextEditPrivate::cursorPositionChanged),
        QObject::connect(control, &QTextEditControl::microFocusChanged,
                         q, [q]() { q->updateMicroFocus(); }),
        QObject::connect(control, &QTextEditControl::currentCharFormatChanged,
                         q, &QTextEdit::currentCharFormatChanged),
        QObject::connect(control, &QTextEditControl::textChanged,
                         q, &QTextEdit::textChanged),
        QObject::connect(control, &QTextEditControl::undoAvailable,
                         q, &QTextEdit::undoAvailable),
        QObject::connect(control, &QTextEditControl::redoAvailable,
                         q, &QTextEdit::redoAvailable),
        QObject::connect(control, &QTextEditControl::copyAvailable,
                         q, &QTextEdit::copyAvailable),
        QObject::connect(control, &QTextEditControl::selectionChanged,
                         q, &QTextEdit::selectionChanged),
        QObject::connect(control, &QTextEditControl::textChanged,
                         q, [q]() { q->updateMicroFocus(); }),
    };

    QTextDocument *doc = control->document();
    // set a null page size initially to avoid any relayouting until the textedit
    // is shown. relayoutDocument() will take care of setting the page size to the
    // viewport dimensions later.
    doc->setPageSize(QSize(0, 0));
    doc->documentLayout()->setPaintDevice(viewport);
    doc->setDefaultFont(q->font());
    doc->setUndoRedoEnabled(false); // flush undo buffer.
    doc->setUndoRedoEnabled(true);

    if (!html.isEmpty())
        control->setHtml(html);

    hbar->setSingleStep(20);
    vbar->setSingleStep(20);

    viewport->setBackgroundRole(QPalette::Base);
    q->setMouseTracking(true);
    q->setAcceptDrops(true);
    q->setFocusPolicy(Qt::StrongFocus);
    q->setAttribute(Qt::WA_KeyCompression);
    q->setAttribute(Qt::WA_InputMethodEnabled);
    q->setInputMethodHints(Qt::ImhMultiLine);
#ifndef QT_NO_CURSOR
    viewport->setCursor(Qt::IBeamCursor);
#endif
}